

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmm.c
# Opt level: O1

int32 hmm_vit_eval(hmm_t *hmm)

{
  uint8 uVar1;
  hmm_context_t *phVar2;
  int *piVar3;
  int32 *piVar4;
  int *piVar5;
  s3senid_t **ppsVar6;
  short *psVar7;
  int iVar8;
  int32 iVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int *piVar20;
  int *piVar21;
  int iVar22;
  int *piVar23;
  bool bVar24;
  bool bVar25;
  
  uVar1 = hmm->n_emit_state;
  if (hmm->mpx == '\0') {
    if (uVar1 != '\x03') {
      if (uVar1 != '\x05') goto LAB_0010f34e;
      phVar2 = hmm->ctx;
      piVar4 = phVar2->senscore;
      piVar3 = *phVar2->tp[hmm->tmatid];
      psVar7 = phVar2->sseq[(hmm->s).ssid];
      iVar8 = piVar4[psVar7[4]] + hmm->state[4].score;
      iVar11 = piVar4[psVar7[3]] + hmm->state[3].score;
      iVar16 = -0x38000000;
      if (iVar8 < -0x37ffffff) {
        iVar8 = -0x38000000;
      }
      if (-0x38000000 < iVar11) {
        iVar16 = piVar3[0x1d] + iVar8;
        iVar15 = piVar3[0x17] + iVar11;
        iVar14 = iVar15;
        if (iVar15 < iVar16) {
          iVar14 = iVar16;
        }
        (hmm->out).history = hmm->state[(ulong)(iVar15 < iVar16) + 3].history;
        iVar16 = -0x38000000;
        if (-0x38000000 < iVar14) {
          iVar16 = iVar14;
        }
        (hmm->out).score = iVar16;
      }
      iVar14 = piVar4[psVar7[2]] + hmm->state[2].score;
      if (-0x38000000 < iVar14) {
        iVar8 = iVar8 + piVar3[0x1c];
        iVar17 = piVar3[0x16] + iVar11;
        iVar13 = piVar3[0x10] + iVar14;
        iVar15 = iVar13;
        if (iVar17 < iVar8) {
          lVar10 = 0x30;
          if (iVar8 < iVar13) goto LAB_0010f8e2;
        }
        else {
          if (iVar13 <= iVar17) {
            iVar15 = iVar17;
          }
          lVar10 = (ulong)(iVar13 <= iVar17) * 0x10 + 0x30;
LAB_0010f8e2:
          iVar8 = iVar15;
          hmm->state[4].history =
               *(anon_union_8_2_743ac376_for_history *)((long)hmm->state + lVar10 + -8);
        }
        iVar15 = -0x38000000;
        if (-0x38000000 < iVar8) {
          iVar15 = iVar8;
        }
        if (iVar16 < iVar8) {
          iVar16 = iVar15;
        }
        hmm->state[4].score = iVar15;
      }
      iVar8 = piVar4[psVar7[1]] + hmm->state[1].score;
      if (-0x38000000 < iVar8) {
        iVar11 = iVar11 + piVar3[0x15];
        iVar17 = piVar3[0xf] + iVar14;
        iVar13 = piVar3[9] + iVar8;
        iVar15 = iVar13;
        if (iVar17 < iVar11) {
          uVar12 = 0x20;
          if (iVar11 < iVar13) goto LAB_0010f953;
        }
        else {
          if (iVar13 <= iVar17) {
            iVar15 = iVar17;
          }
          uVar12 = (ulong)(iVar13 <= iVar17) << 4 | 0x20;
LAB_0010f953:
          iVar11 = iVar15;
          hmm->state[3].history =
               *(anon_union_8_2_743ac376_for_history *)((long)hmm->state + (uVar12 - 8));
        }
        iVar15 = -0x38000000;
        if (-0x38000000 < iVar11) {
          iVar15 = iVar11;
        }
        if (iVar16 < iVar11) {
          iVar16 = iVar15;
        }
        hmm->state[3].score = iVar15;
      }
      iVar15 = piVar4[*psVar7] + hmm->state[0].score;
      iVar14 = iVar14 + piVar3[0xe];
      iVar13 = piVar3[8] + iVar8;
      iVar17 = piVar3[2] + iVar15;
      iVar11 = iVar17;
      if (iVar13 < iVar14) {
        lVar10 = 0x10;
        if (iVar14 < iVar17) goto LAB_0010f9be;
      }
      else {
        if (iVar17 <= iVar13) {
          iVar11 = iVar13;
        }
        lVar10 = (ulong)(iVar17 <= iVar13) * 0x10 + 0x10;
LAB_0010f9be:
        iVar14 = iVar11;
        hmm->state[2].history =
             *(anon_union_8_2_743ac376_for_history *)((long)hmm->state + lVar10 + -8);
      }
      if (iVar14 < -0x37ffffff) {
        iVar14 = -0x38000000;
      }
      hmm->state[2].score = iVar14;
      iVar11 = piVar3[1];
      iVar17 = iVar8 + piVar3[7];
      if (iVar8 + piVar3[7] <= iVar11 + iVar15) {
        hmm->state[1].history = hmm->state[0].history;
        iVar17 = iVar11 + iVar15;
      }
      if (iVar16 < iVar14) {
        iVar16 = iVar14;
      }
      if (iVar17 < -0x37ffffff) {
        iVar17 = -0x38000000;
      }
      if (iVar16 < iVar17) {
        iVar16 = iVar17;
      }
      hmm->state[1].score = iVar17;
      iVar15 = iVar15 + *piVar3;
      if (iVar15 < -0x37ffffff) {
        iVar15 = -0x38000000;
      }
      if (iVar16 < iVar15) {
        iVar16 = iVar15;
      }
      hmm->state[0].score = iVar15;
      goto LAB_0010fa23;
    }
    phVar2 = hmm->ctx;
    piVar4 = phVar2->senscore;
    piVar3 = *phVar2->tp[hmm->tmatid];
    psVar7 = phVar2->sseq[(hmm->s).ssid];
    iVar16 = piVar4[psVar7[2]] + hmm->state[2].score;
    iVar14 = piVar4[psVar7[1]] + hmm->state[1].score;
    iVar8 = -0x38000000;
    iVar11 = -0x38000000;
    if (-0x38000000 < iVar16) {
      iVar8 = piVar3[0xb] + iVar16;
      iVar11 = iVar16 + piVar3[10];
    }
    iVar16 = -0x80000000;
    if (-0x38000000 < iVar14) {
      iVar16 = -0x80000000;
      if (-0x38000000 < piVar3[7]) {
        iVar16 = piVar3[7] + iVar14;
      }
    }
    iVar17 = piVar4[*psVar7] + hmm->state[0].score;
    iVar15 = iVar16;
    if (iVar16 < iVar8) {
      iVar15 = iVar8;
    }
    if (iVar15 < -0x37ffffff) {
      iVar15 = -0x38000000;
    }
    (hmm->out).history = hmm->state[(ulong)(iVar16 < iVar8) + 1].history;
    (hmm->out).score = iVar15;
    iVar8 = -0x38000000;
    if (-0x38000000 < iVar14) {
      iVar8 = piVar3[6] + iVar14;
    }
    iVar16 = -0x38000000;
    if (-0x38000000 < piVar3[2]) {
      iVar16 = piVar3[2] + iVar17;
    }
    iVar13 = iVar16;
    if (iVar8 < iVar11) {
      lVar10 = 0x10;
      if (iVar11 < iVar16) goto LAB_0010f83a;
    }
    else {
      if (iVar16 <= iVar8) {
        iVar13 = iVar8;
      }
      lVar10 = (ulong)(iVar16 <= iVar8) * 0x10 + 0x10;
LAB_0010f83a:
      iVar11 = iVar13;
      hmm->state[2].history =
           *(anon_union_8_2_743ac376_for_history *)((long)hmm->state + lVar10 + -8);
    }
    iVar16 = -0x38000000;
    if (-0x38000000 < iVar11) {
      iVar16 = iVar11;
    }
    iVar13 = -0x38000000;
    hmm->state[2].score = iVar16;
    iVar8 = -0x38000000;
    if (-0x38000000 < iVar14) {
      iVar8 = iVar14 + piVar3[5];
    }
    if (-0x38000000 < iVar17) {
      iVar13 = piVar3[1] + iVar17;
    }
    if (iVar8 <= iVar13) {
      hmm->state[1].history = hmm->state[0].history;
      iVar8 = iVar13;
    }
    if (iVar11 <= iVar15) {
      iVar16 = iVar15;
    }
    iVar11 = -0x38000000;
    if (-0x38000000 < iVar8) {
      iVar11 = iVar8;
    }
    if (iVar16 < iVar8) {
      iVar16 = iVar11;
    }
    hmm->state[1].score = iVar11;
    iVar17 = iVar17 + *piVar3;
    iVar8 = -0x38000000;
    if (-0x38000000 < iVar17) {
      iVar8 = iVar17;
    }
    bVar25 = SBORROW4(iVar17,iVar16);
    iVar11 = iVar17 - iVar16;
    bVar24 = iVar17 == iVar16;
  }
  else {
    if (uVar1 == '\x03') {
      phVar2 = hmm->ctx;
      piVar3 = (hmm->s).mpx_ssid;
      piVar4 = phVar2->senscore;
      piVar5 = *phVar2->tp[hmm->tmatid];
      ppsVar6 = phVar2->sseq;
      iVar11 = -0x38000000;
      iVar8 = -0x38000000;
      iVar16 = -0x38000000;
      if ((long)piVar3[2] != -1) {
        iVar16 = piVar4[ppsVar6[piVar3[2]][2]] + hmm->state[2].score;
        iVar8 = -0x38000000;
        if (-0x38000000 < iVar16) {
          iVar8 = iVar16;
        }
        iVar16 = piVar5[0xb] + iVar8;
      }
      if ((long)piVar3[1] == -1) {
        iVar14 = -0x80000000;
      }
      else {
        iVar14 = piVar4[ppsVar6[piVar3[1]][1]] + hmm->state[1].score;
        iVar11 = -0x38000000;
        if (-0x38000000 < iVar14) {
          iVar11 = iVar14;
        }
        iVar14 = piVar5[7] + iVar11;
      }
      iVar15 = iVar16;
      if (iVar16 <= iVar14) {
        iVar15 = iVar14;
      }
      (hmm->out).history = hmm->state[(ulong)(iVar14 < iVar16) + 1].history;
      iVar16 = -0x38000000;
      if (iVar15 < -0x37ffffff) {
        iVar15 = -0x38000000;
      }
      (hmm->out).score = iVar15;
      iVar17 = piVar4[*ppsVar6[*piVar3]] + hmm->state[0].score;
      if (iVar17 < -0x37ffffff) {
        iVar17 = -0x38000000;
      }
      iVar13 = -0x38000000;
      if (iVar8 != -0x38000000) {
        iVar13 = iVar8 + piVar5[10];
      }
      if (iVar11 != -0x38000000) {
        iVar16 = piVar5[6] + iVar11;
      }
      if (-0x38000000 < piVar5[2]) {
        iVar14 = piVar5[2] + iVar17;
      }
      piVar21 = piVar3;
      if (iVar16 < iVar13) {
        lVar10 = 0x10;
        if (iVar13 < iVar14) goto LAB_0010f78f;
      }
      else {
        bVar24 = iVar14 <= iVar16;
        if (iVar14 <= iVar16) {
          iVar14 = iVar16;
          piVar21 = piVar3 + 1;
        }
        lVar10 = (ulong)bVar24 * 0x10 + 0x10;
LAB_0010f78f:
        iVar13 = iVar14;
        hmm->state[2].history =
             *(anon_union_8_2_743ac376_for_history *)((long)hmm->state + lVar10 + -8);
        piVar3[2] = *piVar21;
      }
      iVar8 = -0x38000000;
      iVar16 = -0x38000000;
      if (-0x38000000 < iVar13) {
        iVar16 = iVar13;
      }
      hmm->state[2].score = iVar16;
      if (iVar11 != -0x38000000) {
        iVar8 = iVar11 + piVar5[5];
      }
      iVar11 = piVar5[1];
      if (iVar8 <= iVar11 + iVar17) {
        hmm->state[1].history = hmm->state[0].history;
        piVar3[1] = *piVar3;
        iVar8 = iVar11 + iVar17;
      }
      if (iVar13 <= iVar15) {
        iVar16 = iVar15;
      }
      iVar11 = -0x38000000;
      if (-0x38000000 < iVar8) {
        iVar11 = iVar8;
      }
      if (iVar16 < iVar8) {
        iVar16 = iVar11;
      }
      hmm->state[1].score = iVar11;
      iVar17 = iVar17 + *piVar5;
      iVar8 = -0x38000000;
      if (-0x38000000 < iVar17) {
        iVar8 = iVar17;
      }
      if (iVar16 < iVar17) {
        iVar16 = iVar8;
      }
      hmm->state[0].score = iVar8;
      goto LAB_0010fa23;
    }
    if (uVar1 != '\x05') {
LAB_0010f34e:
      iVar9 = hmm_vit_eval_anytopo(hmm);
      return iVar9;
    }
    phVar2 = hmm->ctx;
    piVar3 = (hmm->s).mpx_ssid;
    piVar4 = phVar2->senscore;
    piVar5 = *phVar2->tp[hmm->tmatid];
    ppsVar6 = phVar2->sseq;
    iVar11 = -0x38000000;
    iVar8 = -0x38000000;
    iVar16 = -0x38000000;
    if ((long)piVar3[4] != -1) {
      iVar8 = piVar4[ppsVar6[piVar3[4]][4]] + hmm->state[4].score;
      iVar16 = piVar5[0x1d] + iVar8;
    }
    iVar14 = -0x38000000;
    if ((long)piVar3[3] != -1) {
      iVar11 = piVar4[ppsVar6[piVar3[3]][3]] + hmm->state[3].score;
      iVar14 = piVar5[0x17] + iVar11;
    }
    iVar15 = iVar14;
    if (iVar14 < iVar16) {
      iVar15 = iVar16;
    }
    (hmm->out).history = hmm->state[(ulong)(iVar14 < iVar16) + 3].history;
    iVar14 = -0x38000000;
    if (iVar15 < -0x37ffffff) {
      iVar15 = -0x38000000;
    }
    (hmm->out).score = iVar15;
    iVar17 = -0x38000000;
    iVar16 = -0x38000000;
    if ((long)piVar3[2] != -1) {
      iVar17 = piVar4[ppsVar6[piVar3[2]][2]] + hmm->state[2].score;
      iVar16 = piVar5[0x10] + iVar17;
    }
    if (iVar8 != -0x38000000) {
      iVar14 = iVar8 + piVar5[0x1c];
    }
    iVar8 = -0x38000000;
    if (iVar11 != -0x38000000) {
      iVar8 = piVar5[0x16] + iVar11;
    }
    piVar21 = piVar3 + 2;
    piVar23 = piVar21;
    if (iVar8 < iVar14) {
      lVar10 = 0x30;
      if (iVar14 < iVar16) goto LAB_0010f4fd;
    }
    else {
      bVar24 = iVar16 <= iVar8;
      if (iVar16 <= iVar8) {
        iVar16 = iVar8;
        piVar23 = piVar3 + 3;
      }
      lVar10 = (ulong)bVar24 * 0x10 + 0x30;
LAB_0010f4fd:
      hmm->state[4].history =
           *(anon_union_8_2_743ac376_for_history *)((long)hmm->state + lVar10 + -8);
      piVar3[4] = *piVar23;
      iVar14 = iVar16;
    }
    iVar8 = -0x38000000;
    iVar16 = -0x38000000;
    if (-0x38000000 < iVar14) {
      iVar16 = iVar14;
    }
    hmm->state[4].score = iVar16;
    iVar22 = -0x38000000;
    iVar13 = -0x38000000;
    if ((long)piVar3[1] != -1) {
      iVar22 = piVar4[ppsVar6[piVar3[1]][1]] + hmm->state[1].score;
      iVar13 = piVar5[9] + iVar22;
    }
    if (iVar11 != -0x38000000) {
      iVar8 = iVar11 + piVar5[0x15];
    }
    iVar11 = -0x38000000;
    if (iVar17 != -0x38000000) {
      iVar11 = piVar5[0xf] + iVar17;
    }
    piVar23 = piVar3 + 1;
    piVar20 = piVar23;
    if (iVar11 < iVar8) {
      uVar12 = 0x20;
      if (iVar8 < iVar13) goto LAB_0010f5af;
    }
    else {
      bVar24 = iVar13 <= iVar11;
      if (iVar13 <= iVar11) {
        iVar13 = iVar11;
        piVar20 = piVar21;
      }
      uVar12 = (ulong)bVar24 << 4 | 0x20;
LAB_0010f5af:
      hmm->state[3].history =
           *(anon_union_8_2_743ac376_for_history *)((long)hmm->state + (uVar12 - 8));
      piVar3[3] = *piVar20;
      iVar8 = iVar13;
    }
    iVar11 = -0x38000000;
    if (-0x38000000 < iVar8) {
      iVar11 = iVar8;
    }
    iVar13 = -0x38000000;
    hmm->state[3].score = iVar11;
    iVar18 = -0x38000000;
    if (iVar17 != -0x38000000) {
      iVar18 = iVar17 + piVar5[0xe];
    }
    iVar17 = piVar4[*ppsVar6[*piVar3]] + hmm->state[0].score;
    if (iVar22 != -0x38000000) {
      iVar13 = piVar5[8] + iVar22;
    }
    iVar19 = piVar5[2] + iVar17;
    piVar21 = piVar3;
    if (iVar13 < iVar18) {
      lVar10 = 0x10;
      if (iVar18 < iVar19) goto LAB_0010f64d;
    }
    else {
      bVar24 = iVar19 <= iVar13;
      if (iVar19 <= iVar13) {
        iVar19 = iVar13;
        piVar21 = piVar23;
      }
      lVar10 = (ulong)bVar24 * 0x10 + 0x10;
LAB_0010f64d:
      iVar18 = iVar19;
      hmm->state[2].history =
           *(anon_union_8_2_743ac376_for_history *)((long)hmm->state + lVar10 + -8);
      piVar3[2] = *piVar21;
    }
    iVar19 = -0x38000000;
    iVar13 = -0x38000000;
    if (-0x38000000 < iVar18) {
      iVar13 = iVar18;
    }
    hmm->state[2].score = iVar13;
    if (iVar22 != -0x38000000) {
      iVar19 = iVar22 + piVar5[7];
    }
    iVar22 = piVar5[1];
    if (iVar19 <= iVar22 + iVar17) {
      hmm->state[1].history = hmm->state[0].history;
      piVar3[1] = *piVar3;
      iVar19 = iVar22 + iVar17;
    }
    if (iVar14 <= iVar15) {
      iVar16 = iVar15;
    }
    if (iVar16 < iVar8) {
      iVar16 = iVar11;
    }
    if (iVar16 < iVar18) {
      iVar16 = iVar13;
    }
    iVar8 = -0x38000000;
    if (-0x38000000 < iVar19) {
      iVar8 = iVar19;
    }
    if (iVar16 < iVar19) {
      iVar16 = iVar8;
    }
    hmm->state[1].score = iVar8;
    iVar8 = iVar17 + *piVar5;
    if (iVar17 + *piVar5 < -0x37ffffff) {
      iVar8 = -0x38000000;
    }
    bVar25 = SBORROW4(iVar8,iVar16);
    iVar11 = iVar8 - iVar16;
    bVar24 = iVar8 == iVar16;
  }
  if (!bVar24 && bVar25 == iVar11 < 0) {
    iVar16 = iVar8;
  }
  hmm->state[0].score = iVar8;
LAB_0010fa23:
  hmm->bestscore = iVar16;
  return iVar16;
}

Assistant:

int32
hmm_vit_eval(hmm_t * hmm)
{
    if (hmm_is_mpx(hmm)) {
        if (hmm_n_emit_state(hmm) == 5)
            return hmm_vit_eval_5st_lr_mpx(hmm);
        else if (hmm_n_emit_state(hmm) == 3)
            return hmm_vit_eval_3st_lr_mpx(hmm);
        else
            return hmm_vit_eval_anytopo(hmm);
    }
    else {
        if (hmm_n_emit_state(hmm) == 5)
            return hmm_vit_eval_5st_lr(hmm);
        else if (hmm_n_emit_state(hmm) == 3)
            return hmm_vit_eval_3st_lr(hmm);
        else
            return hmm_vit_eval_anytopo(hmm);
    }
}